

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O1

void __thiscall SerializeSpan_Write_Test::TestBody(SerializeSpan_Write_Test *this)

{
  pointer *pppvVar1;
  Clause CVar2;
  uint uVar3;
  char *pcVar4;
  iterator __position;
  VTable *pVVar5;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_00;
  undefined8 *puVar6;
  undefined8 *puVar7;
  FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *pFVar8;
  FailureReporterInterface *pFVar9;
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_01;
  UntypedActionResultHolderBase *pUVar10;
  long lVar11;
  char *in_RCX;
  int line;
  int line_00;
  char *in_R8;
  char *pcVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar13;
  size_type __dnew;
  array<(anonymous_namespace)::SerializeSpan::simple_struct,_2UL> my;
  mock_span_archive arch;
  undefined1 local_158 [32];
  char *local_138;
  undefined8 uStack_130;
  code *local_128;
  pointer ppvStack_120;
  VTable *local_110;
  MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  local_108;
  void_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_> local_d8
  ;
  mock_span_archive local_c0;
  
  pcVar12 = local_158;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_c0);
  local_c0.gmock01_writen_161.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_001980e8;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_c0.gmock01_readn_162.super_UntypedFunctionMockerBase);
  local_c0.gmock01_readn_162.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198248;
  local_d8.vtable_ =
       (VTable *)
       testing::internal::
       MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001981a8;
  anon_unknown.dwarf_7c001::SerializeSpan::mock_span_archive::gmock_writen
            (&local_108,&local_c0,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&local_d8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::InternalExpectedAt(&local_108,(char *)0xc0,line,in_RCX,in_R8);
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Times(this_00,1);
  local_e8 = (void_type *)operator_new(1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::serialize::archive::void_type*>(&local_e0,local_e8);
  puVar6 = (undefined8 *)operator_new(0x10);
  *puVar6 = &PTR__ActionInterface_00198728;
  puVar7 = (undefined8 *)operator_new(0x18);
  puVar7[1] = 0x100000001;
  *puVar7 = &PTR___Sp_counted_base_00198778;
  puVar7[2] = puVar6;
  local_128 = (code *)0x0;
  ppvStack_120 = (pointer)0x0;
  local_138 = (char *)0x0;
  uStack_130 = 0;
  local_138 = (char *)operator_new(0x10);
  *(undefined8 **)local_138 = puVar6;
  *(undefined8 **)(local_138 + 8) = puVar7;
  ppvStack_120 = (pointer)std::
                          _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::ActionAdapter>
                          ::_M_invoke;
  local_128 = std::
              _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::ActionAdapter>
              ::_M_manager;
  CVar2 = (this_00->super_ExpectationBase).last_clause_;
  local_110 = (VTable *)0x4c;
  local_158._0_8_ =
       (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
        *)(local_158 + 0x10);
  pFVar8 = (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
            *)std::__cxx11::string::_M_create((ulong *)local_158,(ulong)&local_110);
  pVVar5 = local_110;
  local_158._16_8_ = local_110;
  local_158._0_8_ = pFVar8;
  memcpy(pFVar8,".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().",0x4c)
  ;
  local_158._8_8_ = pVVar5;
  *(undefined1 *)
   ((long)&(pFVar8->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase + (long)pVVar5)
       = 0;
  if (5 < (int)CVar2) {
    uVar3 = (this_00->super_ExpectationBase).line_;
    pcVar4 = (this_00->super_ExpectationBase).file_;
    pFVar9 = testing::internal::GetFailureReporter();
    in_RCX = (char *)(ulong)uVar3;
    (*pFVar9->_vptr_FailureReporterInterface[2])(pFVar9,0,pcVar4);
    in_R8 = pcVar12;
  }
  if ((FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
       *)local_158._0_8_ !=
      (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
       *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)(_func_int ***)local_158._16_8_ + 1));
  }
  (this_00->super_ExpectationBase).last_clause_ = kWillOnce;
  pFVar8 = (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
            *)operator_new(0x20);
  (pFVar8->super_UntypedFunctionMockerBase).name_ = (char *)0x0;
  (pFVar8->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
  super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pFVar8->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  (pFVar8->super_UntypedFunctionMockerBase).mock_obj_ = (void *)0x0;
  if (local_128 != (code *)0x0) {
    (*local_128)(pFVar8,&local_138,2);
    (pFVar8->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
    super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = ppvStack_120;
    (pFVar8->super_UntypedFunctionMockerBase).name_ = (char *)local_128;
  }
  __position._M_current =
       (this_00->super_ExpectationBase).untyped_actions_.
       super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_158._0_8_ = pFVar8;
  if (__position._M_current ==
      (this_00->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void_const*,std::allocator<void_const*>>::_M_realloc_insert<void_const*>
              ((vector<void_const*,std::allocator<void_const*>> *)
               &(this_00->super_ExpectationBase).untyped_actions_,__position,(void **)local_158);
  }
  else {
    *__position._M_current = pFVar8;
    pppvVar1 = &(this_00->super_ExpectationBase).untyped_actions_.
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppvVar1 = *pppvVar1 + 1;
  }
  if ((this_00->super_ExpectationBase).cardinality_specified_ == false) {
    testing::Exactly((testing *)local_158,
                     (int)((ulong)((long)(this_00->super_ExpectationBase).untyped_actions_.
                                         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->super_ExpectationBase).untyped_actions_.
                                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
    (this_00->super_ExpectationBase).cardinality_.impl_.
    super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_158._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this_00->super_ExpectationBase).cardinality_.impl_.
                super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
    }
  }
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,3);
  }
  if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
  }
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                *)&local_108.matchers_);
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase(&local_d8);
  local_108.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>_>
  .
  super__Head_base<0UL,_testing::Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>,_false>
  ._M_head_impl.
  super_MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>.
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       testing::internal::
       MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_108.function_mocker_ =
       (FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
        *)&PTR__MatcherBase_001981a8;
  anon_unknown.dwarf_7c001::SerializeSpan::mock_span_archive::gmock_readn
            ((MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
              *)local_158,&local_c0,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&local_108);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                        *)local_158,(char *)0xc1,line_00,in_RCX,in_R8);
  testing::internal::
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Times(this_01,0);
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                *)(local_158 + 8));
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                *)&local_108);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            ((UntypedFunctionMockerBase *)&local_c0,&local_c0,"writen");
  local_158._0_8_ =
       (FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
        *)0x2;
  local_158._8_8_ = &local_108;
  pUVar10 = testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
                      ((UntypedFunctionMockerBase *)&local_c0,local_158);
  if (pUVar10 == (UntypedActionResultHolderBase *)0x0) {
    bVar13 = true;
  }
  else {
    lVar11 = __dynamic_cast(pUVar10,&testing::internal::UntypedActionResultHolderBase::typeinfo,
                            &testing::internal::
                             ActionResultHolder<pstore::serialize::archive::void_type>::typeinfo,0);
    bVar13 = lVar11 != 0;
  }
  bVar13 = testing::internal::IsTrue(bVar13);
  if (!bVar13) {
    testing::internal::GTestLog::GTestLog
              ((GTestLog *)&local_138,GTEST_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-port.h"
               ,0x454);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    testing::internal::GTestLog::~GTestLog((GTestLog *)&local_138);
  }
  if (pUVar10 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar10->_vptr_UntypedActionResultHolderBase[1])(pUVar10);
  }
  testing::internal::
  FunctionMocker<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::~FunctionMocker(&local_c0.gmock01_readn_162);
  testing::internal::
  FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::~FunctionMocker(&local_c0.gmock01_writen_161);
  return;
}

Assistant:

TEST_F (SerializeSpan, Write) {
    using ::testing::_;
    using ::testing::Return;

    SerializeSpan::mock_span_archive arch;

    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (arch, writen (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (arch, readn (_)).Times (0);

    std::array<simple_struct, 2> my;
    ::pstore::gsl::span<simple_struct> span{my};
    pstore::serialize::write (arch, span);
}